

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

bool nite::mouseReleased(uint Button)

{
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  uint uVar4;
  
  uVar4 = Button - 0xc9;
  if (100 < uVar4) {
    return false;
  }
  if (isbuttonStateReleased[uVar4] == false) {
    bVar1 = buttonState[uVar4];
    pbVar3 = buttonStateReleased + uVar4;
    pbVar2 = pbVar3;
    if (bVar1 == false) {
      if (*pbVar3 != true) {
        return false;
      }
      pbVar2 = isbuttonStateReleased + uVar4;
      *pbVar3 = false;
    }
    *pbVar2 = true;
    return (bool)(bVar1 ^ 1);
  }
  return true;
}

Assistant:

bool nite::mouseReleased(unsigned Button){
	Button -= 201;
	if (Button >= niteKeysn){
		return 0;
	}

	if (isbuttonStateReleased[Button]){
		return 1;
	}

	if (buttonState[Button]){
		buttonStateReleased[Button] = 1;
		return 0;
	}

	if (!buttonState[Button] and buttonStateReleased[Button]){
		buttonStateReleased[Button] = 0;
		isbuttonStateReleased[Button] = 1;
		return 1;
	}

	return 0;
}